

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_177::GetParents::~GetParents(GetParents *this)

{
  pointer ppEVar1;
  pointer pTVar2;
  
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->inner).parentMap._M_h);
  ppEVar1 = (this->inner).
            super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .expressionStack.flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1,(long)*(pointer *)
                                   ((long)&(this->inner).
                                           super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                                           .expressionStack.flexible.
                                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                           ._M_impl.super__Vector_impl_data + 0x10) - (long)ppEVar1)
    ;
  }
  pTVar2 = (this->inner).
           super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
           .
           super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->inner).
                                          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                                          .
                                          super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                                          .
                                          super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
                                  + 0x10) - (long)pTVar2);
    return;
  }
  return;
}

Assistant:

Expression* getParent(LocalGet* curr) const {
    auto iter = inner.parentMap.find(curr);
    assert(iter != inner.parentMap.end());
    return iter->second;
  }